

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O2

Maybe<unsigned_long> __thiscall
rc::Seq<unsigned_long>::SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_>::next
          (SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_> *this)

{
  long in_RSI;
  Maybe<unsigned_long> MVar1;
  
  MVar1 = rc::shrink::detail::TowardsSeq<unsigned_long>::operator()
                    ((TowardsSeq<unsigned_long> *)(in_RSI + 8));
  MVar1.m_storage = (Storage)this;
  return MVar1;
}

Assistant:

Maybe<T> next() override { return m_impl(); }